

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

int32_t unorm2_getDecomposition_63
                  (UNormalizer2 *norm2,UChar32 c,UChar *decomposition,int32_t capacity,
                  UErrorCode *pErrorCode)

{
  UBool UVar1;
  char cVar2;
  Char16Ptr local_90 [3];
  undefined1 local_78 [8];
  UnicodeString destString;
  UErrorCode *pErrorCode_local;
  int32_t capacity_local;
  UChar *decomposition_local;
  UChar32 c_local;
  UNormalizer2 *norm2_local;
  
  destString.fUnion._48_8_ = pErrorCode;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 != '\0') {
    return 0;
  }
  if (decomposition == (UChar *)0x0) {
    if (capacity != 0) {
LAB_0032fbcd:
      *(undefined4 *)destString.fUnion._48_8_ = 1;
      return 0;
    }
  }
  else if (capacity < 0) goto LAB_0032fbcd;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_78,decomposition,0,capacity);
  cVar2 = (**(code **)(*(long *)norm2 + 0x38))(norm2,c,(UnicodeString *)local_78);
  if (cVar2 == '\0') {
    norm2_local._4_4_ = -1;
  }
  else {
    icu_63::Char16Ptr::Char16Ptr(local_90,decomposition);
    norm2_local._4_4_ =
         icu_63::UnicodeString::extract
                   ((UnicodeString *)local_78,local_90,capacity,
                    (UErrorCode *)destString.fUnion._48_8_);
    icu_63::Char16Ptr::~Char16Ptr(local_90);
  }
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_78);
  return norm2_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
unorm2_getDecomposition(const UNormalizer2 *norm2,
                        UChar32 c, UChar *decomposition, int32_t capacity,
                        UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(decomposition==NULL ? capacity!=0 : capacity<0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UnicodeString destString(decomposition, 0, capacity);
    if(reinterpret_cast<const Normalizer2 *>(norm2)->getDecomposition(c, destString)) {
        return destString.extract(decomposition, capacity, *pErrorCode);
    } else {
        return -1;
    }
}